

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EpsRefine.h
# Opt level: O0

ostream * covenant::operator<<(ostream *o,GeneralizationMethod gen)

{
  string *msg;
  int in_ESI;
  ostream *in_RDI;
  allocator *this;
  allocator local_31;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  if (in_ESI == 0) {
    std::operator<<(in_RDI,"greedy");
  }
  else {
    if (in_ESI != 1) {
      msg = (string *)__cxa_allocate_exception(0x20);
      this = &local_31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"invalid generalization method",this);
      error::error((error *)this,msg);
      __cxa_throw(msg,&error::typeinfo,error::~error);
    }
    std::operator<<(in_RDI,"max-gen");
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& o, GeneralizationMethod gen)
{
    if (gen == GREEDY)
      o << "greedy";
    else if (gen == MAX_GEN)
      o << "max-gen";
    else 
      throw error("invalid generalization method");
    return o;
}